

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitester.cpp
# Opt level: O3

void unescape_unicode_test(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  ssize_t sVar3;
  UniValue *pUVar4;
  string *psVar5;
  size_t in_RCX;
  long in_FS_OFFSET;
  UniValue val;
  UniValue local_78;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_78.val.field_2;
  local_78.val._M_string_length = 0;
  local_78.val.field_2._M_local_buf[0] = '\0';
  local_78.typ = VNULL;
  local_78.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.val._M_dataplus._M_p = (pointer)paVar1;
  sVar3 = UniValue::read(&local_78,10,"[\"\\u0022\"]",in_RCX);
  if ((char)sVar3 == '\0') {
    __assert_fail("testResult",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/univalue/test/unitester.cpp"
                  ,0x88,"void unescape_unicode_test()");
  }
  pUVar4 = UniValue::operator[](&local_78,0);
  psVar5 = UniValue::get_str_abi_cxx11_(pUVar4);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (psVar5,"\"");
  if (iVar2 != 0) {
    __assert_fail("val[0].get_str() == \"\\\"\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/univalue/test/unitester.cpp"
                  ,0x89,"void unescape_unicode_test()");
  }
  sVar3 = UniValue::read(&local_78,10,"[\"\\u0191\"]",in_RCX);
  if ((char)sVar3 == '\0') {
    __assert_fail("testResult",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/univalue/test/unitester.cpp"
                  ,0x8c,"void unescape_unicode_test()");
  }
  pUVar4 = UniValue::operator[](&local_78,0);
  psVar5 = UniValue::get_str_abi_cxx11_(pUVar4);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (psVar5,anon_var_dwarf_42d1);
  if (iVar2 != 0) {
    __assert_fail("val[0].get_str() == \"\\xc6\\x91\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/univalue/test/unitester.cpp"
                  ,0x8d,"void unescape_unicode_test()");
  }
  sVar3 = UniValue::read(&local_78,10,"[\"\\u2191\"]",in_RCX);
  if ((char)sVar3 == '\0') {
    __assert_fail("testResult",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/univalue/test/unitester.cpp"
                  ,0x90,"void unescape_unicode_test()");
  }
  pUVar4 = UniValue::operator[](&local_78,0);
  psVar5 = UniValue::get_str_abi_cxx11_(pUVar4);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (psVar5,anon_var_dwarf_4307);
  if (iVar2 != 0) {
    __assert_fail("val[0].get_str() == \"\\xe2\\x86\\x91\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/univalue/test/unitester.cpp"
                  ,0x91,"void unescape_unicode_test()");
  }
  sVar3 = UniValue::read(&local_78,0x10,"[\"\\ud834\\udd61\"]",in_RCX);
  if ((char)sVar3 == '\0') {
    __assert_fail("testResult",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/univalue/test/unitester.cpp"
                  ,0x94,"void unescape_unicode_test()");
  }
  pUVar4 = UniValue::operator[](&local_78,0);
  psVar5 = UniValue::get_str_abi_cxx11_(pUVar4);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (psVar5,anon_var_dwarf_4349);
  if (iVar2 == 0) {
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_78.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.val._M_dataplus._M_p != paVar1) {
      operator_delete(local_78.val._M_dataplus._M_p,
                      CONCAT71(local_78.val.field_2._M_allocated_capacity._1_7_,
                               local_78.val.field_2._M_local_buf[0]) + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("val[0].get_str() == \"\\xf0\\x9d\\x85\\xa1\"",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/univalue/test/unitester.cpp"
                ,0x95,"void unescape_unicode_test()");
}

Assistant:

void unescape_unicode_test()
{
    UniValue val;
    bool testResult;
    // Escaped ASCII (quote)
    testResult = val.read("[\"\\u0022\"]");
    assert(testResult);
    assert(val[0].get_str() == "\"");
    // Escaped Basic Plane character, two-byte UTF-8
    testResult = val.read("[\"\\u0191\"]");
    assert(testResult);
    assert(val[0].get_str() == "\xc6\x91");
    // Escaped Basic Plane character, three-byte UTF-8
    testResult = val.read("[\"\\u2191\"]");
    assert(testResult);
    assert(val[0].get_str() == "\xe2\x86\x91");
    // Escaped Supplementary Plane character U+1d161
    testResult = val.read("[\"\\ud834\\udd61\"]");
    assert(testResult);
    assert(val[0].get_str() == "\xf0\x9d\x85\xa1");
}